

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderRendering.cpp
# Opt level: O1

void __thiscall glcts::GeometryShaderRenderingCase::initTest(GeometryShaderRenderingCase *this)

{
  uint uVar1;
  GeometryShaderRenderingCase *pGVar2;
  bool bVar3;
  int iVar4;
  deUint32 dVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  GLuint GVar9;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  GLuint *pGVar11;
  TestError *pTVar12;
  GLuint *pGVar13;
  GLuint *pGVar14;
  char *gs_code_ptr;
  char *fs_code_ptr;
  uint local_128;
  int local_124;
  GLuint local_120;
  int local_11c;
  GLuint local_118;
  int local_114;
  GeometryShaderRenderingCase *local_110;
  GLuint *local_108;
  GLuint *local_100;
  GLuint *local_f8;
  GLuint *local_f0;
  GLuint *local_e8;
  GLuint *local_e0;
  GLuint *local_d8;
  GLuint *local_d0;
  GLuint *local_c8;
  GLuint *local_c0;
  GLuint *local_b8;
  GLuint *local_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  char *vs_code_ptr;
  string vs_code;
  string gs_code;
  string fs_code;
  long lVar10;
  
  iVar4 = (*this->m_context->m_renderCtx->_vptr_RenderContext[3])();
  lVar10 = CONCAT44(extraout_var,iVar4);
  (*(this->super_TestCaseBase).super_TestCase.super_TestNode._vptr_TestNode[9])(&fs_code,this);
  (*(this->super_TestCaseBase).super_TestCase.super_TestNode._vptr_TestNode[10])(&gs_code,this);
  local_128 = (*(this->super_TestCaseBase).super_TestCase.super_TestNode._vptr_TestNode[5])(this);
  (*(this->super_TestCaseBase).super_TestCase.super_TestNode._vptr_TestNode[0x15])(&vs_code,this);
  (**(code **)(lVar10 + 0xff0))(0xd05,1);
  (**(code **)(lVar10 + 0xff0))(0xcf5,1);
  local_e0 = &this->m_instanced_raw_arrays_bo_id;
  (**(code **)(lVar10 + 0x6c8))(1);
  local_f0 = &this->m_instanced_unordered_arrays_bo_id;
  (**(code **)(lVar10 + 0x6c8))(1);
  local_100 = &this->m_instanced_unordered_elements_bo_id;
  (**(code **)(lVar10 + 0x6c8))(1);
  local_e8 = &this->m_noninstanced_raw_arrays_bo_id;
  (**(code **)(lVar10 + 0x6c8))(1);
  local_f8 = &this->m_noninstanced_unordered_arrays_bo_id;
  (**(code **)(lVar10 + 0x6c8))(1);
  local_108 = &this->m_noninstanced_unordered_elements_bo_id;
  iVar4 = 1;
  (**(code **)(lVar10 + 0x6c8))(1);
  local_b0 = &this->m_fbo_id;
  local_b8 = &this->m_instanced_fbo_id;
  local_c0 = &this->m_read_fbo_id;
  local_c8 = &this->m_instanced_read_fbo_id;
  local_d0 = &this->m_to_id;
  local_d8 = &this->m_instanced_to_id;
  local_110 = this;
  while( true ) {
    pGVar2 = local_110;
    pGVar14 = local_c0;
    pGVar11 = local_b0;
    if (iVar4 == 0) {
      pGVar14 = local_c8;
      pGVar11 = local_b8;
    }
    fs_code_ptr = (char *)((ulong)fs_code_ptr & 0xffffffff00000000);
    gs_code_ptr = (char *)((ulong)gs_code_ptr & 0xffffffff00000000);
    pGVar13 = local_d0;
    if (iVar4 == 0) {
      pGVar13 = local_d8;
    }
    uVar1 = local_128;
    if (iVar4 == 1) {
      uVar1 = 1;
    }
    local_114 = iVar4;
    (*(local_110->super_TestCaseBase).super_TestCase.super_TestNode._vptr_TestNode[0xd])
              (local_110,(ulong)uVar1,&gs_code_ptr,&fs_code_ptr);
    (**(code **)(lVar10 + 0x6f8))(1,pGVar13);
    (**(code **)(lVar10 + 0xb8))(0xde1,*pGVar13);
    (**(code **)(lVar10 + 0x1380))
              (0xde1,1,0x8058,(ulong)gs_code_ptr & 0xffffffff,(ulong)fs_code_ptr & 0xffffffff);
    dVar5 = (**(code **)(lVar10 + 0x800))();
    glu::checkError(dVar5,"Could not configure a 2D texture object",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderRendering.cpp"
                    ,0x37c);
    (**(code **)(lVar10 + 0x6d0))(1,pGVar11);
    (**(code **)(lVar10 + 0x78))(0x8ca9,*pGVar11);
    (**(code **)(lVar10 + 0x6a0))(0x8ca9,0x8ce0,0xde1,*pGVar13,0);
    dVar5 = (**(code **)(lVar10 + 0x800))();
    glu::checkError(dVar5,"Could not configure draw framebuffer object",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderRendering.cpp"
                    ,900);
    iVar4 = (**(code **)(lVar10 + 0x170))(0x8ca9);
    if (iVar4 != 0x8cd5) break;
    (**(code **)(lVar10 + 0x6d0))(1,pGVar14);
    (**(code **)(lVar10 + 0x78))(0x8ca8,*pGVar14);
    (**(code **)(lVar10 + 0x6a0))(0x8ca8,0x8ce0,0xde1,*pGVar13,0);
    dVar5 = (**(code **)(lVar10 + 0x800))();
    glu::checkError(dVar5,"Could not configure read framebuffer object",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderRendering.cpp"
                    ,0x391);
    iVar4 = (**(code **)(lVar10 + 0x170))(0x8ca8);
    iVar8 = local_114;
    if (iVar4 != 0x8cd5) {
      pTVar12 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar12,"Read framebuffer is reported to be incomplete",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderRendering.cpp"
                 ,0x395);
      goto LAB_00d1f99f;
    }
    iVar4 = local_114 + -1;
    pGVar11 = local_e8;
    if (local_114 == 0) {
      pGVar11 = local_e0;
    }
    GVar9 = *pGVar11;
    iVar6 = (*(pGVar2->super_TestCaseBase).super_TestCase.super_TestNode._vptr_TestNode[0xb])
                      (pGVar2,(ulong)(local_114 == 0));
    iVar7 = (*(pGVar2->super_TestCaseBase).super_TestCase.super_TestNode._vptr_TestNode[0xc])
                      (pGVar2,(ulong)(iVar8 == 0));
    local_a0 = CONCAT44(extraout_var_00,iVar7);
    pGVar11 = local_f8;
    if (iVar8 == 0) {
      pGVar11 = local_f0;
    }
    local_118 = *pGVar11;
    local_11c = (*(pGVar2->super_TestCaseBase).super_TestCase.super_TestNode._vptr_TestNode[0xe])
                          (pGVar2,(ulong)(iVar8 == 0));
    iVar7 = (*(pGVar2->super_TestCaseBase).super_TestCase.super_TestNode._vptr_TestNode[0xf])
                      (pGVar2,(ulong)(iVar8 == 0));
    local_a8 = CONCAT44(extraout_var_01,iVar7);
    pGVar11 = local_108;
    if (iVar8 == 0) {
      pGVar11 = local_100;
    }
    local_120 = *pGVar11;
    local_124 = (*(pGVar2->super_TestCaseBase).super_TestCase.super_TestNode._vptr_TestNode[0x10])
                          (pGVar2,(ulong)(iVar8 == 0));
    iVar8 = (*(pGVar2->super_TestCaseBase).super_TestCase.super_TestNode._vptr_TestNode[0x11])
                      (pGVar2,(ulong)(iVar8 == 0));
    (**(code **)(lVar10 + 0x40))(0x8892,GVar9);
    (**(code **)(lVar10 + 0x150))(0x8892,iVar6,local_a0,0x88e6);
    (**(code **)(lVar10 + 0x40))(0x8892,local_118);
    (**(code **)(lVar10 + 0x150))(0x8892,local_11c,local_a8,0x88e6);
    (**(code **)(lVar10 + 0x40))(0x8892,local_120);
    (**(code **)(lVar10 + 0x150))(0x8892,local_124,iVar8,0x88e6);
    pGVar2 = local_110;
    if (iVar4 != 0) {
      dVar5 = (**(code **)(lVar10 + 0x800))();
      glu::checkError(dVar5,"Could not configure test buffer objects",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderRendering.cpp"
                      ,0x3af);
      (**(code **)(lVar10 + 0x708))(1,&pGVar2->m_vao_id);
      (**(code **)(lVar10 + 0xd8))(pGVar2->m_vao_id);
      dVar5 = (**(code **)(lVar10 + 0x800))();
      glu::checkError(dVar5,"Could not generate & bind a vertex array object",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderRendering.cpp"
                      ,0x3b5);
      fs_code_ptr = fs_code._M_dataplus._M_p;
      gs_code_ptr = gs_code._M_dataplus._M_p;
      vs_code_ptr = vs_code._M_dataplus._M_p;
      GVar9 = (**(code **)(lVar10 + 0x3f0))(0x8b30);
      pGVar2->m_fs_id = GVar9;
      GVar9 = (**(code **)(lVar10 + 0x3f0))
                        ((pGVar2->super_TestCaseBase).m_glExtTokens.GEOMETRY_SHADER);
      pGVar2->m_gs_id = GVar9;
      GVar9 = (**(code **)(lVar10 + 0x3c8))();
      pGVar2->m_po_id = GVar9;
      GVar9 = (**(code **)(lVar10 + 0x3f0))(0x8b31);
      pGVar2->m_vs_id = GVar9;
      dVar5 = (**(code **)(lVar10 + 0x800))();
      glu::checkError(dVar5,"Could not create shader/program objects",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderRendering.cpp"
                      ,0x3c1);
      bVar3 = TestCaseBase::buildProgram
                        (&pGVar2->super_TestCaseBase,pGVar2->m_po_id,pGVar2->m_fs_id,1,&fs_code_ptr,
                         pGVar2->m_gs_id,1,&gs_code_ptr,pGVar2->m_vs_id,1,&vs_code_ptr,(bool *)0x0);
      if (!bVar3) {
        pTVar12 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar12,"Could not build shader program",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderRendering.cpp"
                   ,0x3c5);
        __cxa_throw(pTVar12,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
      }
      GVar9 = (**(code **)(lVar10 + 0xb48))(pGVar2->m_po_id,"renderingTargetSize");
      pGVar2->m_renderingTargetSize_uniform_location = GVar9;
      GVar9 = (**(code **)(lVar10 + 0xb48))(pGVar2->m_po_id,"singleRenderingTargetSize");
      pGVar2->m_singleRenderingTargetSize_uniform_location = GVar9;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)vs_code._M_dataplus._M_p != &vs_code.field_2) {
        operator_delete(vs_code._M_dataplus._M_p,vs_code.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)gs_code._M_dataplus._M_p != &gs_code.field_2) {
        operator_delete(gs_code._M_dataplus._M_p,gs_code.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)fs_code._M_dataplus._M_p != &fs_code.field_2) {
        operator_delete(fs_code._M_dataplus._M_p,fs_code.field_2._M_allocated_capacity + 1);
      }
      return;
    }
  }
  pTVar12 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (pTVar12,"Draw framebuffer is reported to be incomplete",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderRendering.cpp"
             ,0x388);
LAB_00d1f99f:
  __cxa_throw(pTVar12,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void GeometryShaderRenderingCase::initTest()
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Retrieve derivative class' properties */
	std::string  fs_code	 = getFragmentShaderCode();
	std::string  gs_code	 = getGeometryShaderCode();
	unsigned int n			 = 0;
	unsigned int n_instances = getAmountOfDrawInstances();
	std::string  vs_code	 = getVertexShaderCode();

	/* Set pixel storage properties before we continue */
	gl.pixelStorei(GL_PACK_ALIGNMENT, 1);
	gl.pixelStorei(GL_UNPACK_ALIGNMENT, 1);

	/* Create buffer objects the derivative implementation will fill with data */
	gl.genBuffers(1, &m_instanced_raw_arrays_bo_id);
	gl.genBuffers(1, &m_instanced_unordered_arrays_bo_id);
	gl.genBuffers(1, &m_instanced_unordered_elements_bo_id);
	gl.genBuffers(1, &m_noninstanced_raw_arrays_bo_id);
	gl.genBuffers(1, &m_noninstanced_unordered_arrays_bo_id);
	gl.genBuffers(1, &m_noninstanced_unordered_elements_bo_id);

	/* Set up a separate set of objects, that will be used for testing instanced and non-instanced draw calls */
	for (n = 0; n < 2 /* non-/instanced draw calls */; ++n)
	{
		bool is_instanced = (n == 1);

		glw::GLuint* draw_fbo_id_ptr = !is_instanced ? &m_fbo_id : &m_instanced_fbo_id;
		glw::GLuint* read_fbo_id_ptr = (!is_instanced) ? &m_read_fbo_id : &m_instanced_read_fbo_id;
		unsigned int to_height		 = 0;
		unsigned int to_width		 = 0;
		glw::GLuint* to_id_ptr		 = (!is_instanced) ? &m_to_id : &m_instanced_to_id;

		/* n == 0: non-instanced draw calls, instanced otherwise */
		getRenderTargetSize((n == 0) ? 1 : n_instances, &to_width, &to_height);

		/* Create a texture object we will be rendering to */
		gl.genTextures(1, to_id_ptr);
		gl.bindTexture(GL_TEXTURE_2D, *to_id_ptr);
		gl.texStorage2D(GL_TEXTURE_2D, 1 /* levels */, GL_RGBA8, to_width, to_height);

		GLU_EXPECT_NO_ERROR(gl.getError(), "Could not configure a 2D texture object");

		/* Create and configure a framebuffer object that will be used for rendering */
		gl.genFramebuffers(1, draw_fbo_id_ptr);
		gl.bindFramebuffer(GL_DRAW_FRAMEBUFFER, *draw_fbo_id_ptr);

		gl.framebufferTexture2D(GL_DRAW_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, *to_id_ptr, 0 /* level */);

		GLU_EXPECT_NO_ERROR(gl.getError(), "Could not configure draw framebuffer object");

		if (gl.checkFramebufferStatus(GL_DRAW_FRAMEBUFFER) != GL_FRAMEBUFFER_COMPLETE)
		{
			TCU_FAIL("Draw framebuffer is reported to be incomplete");
		} /* if (gl.checkFramebufferStatus(GL_DRAW_FRAMEBUFFER) != GL_FRAMEBUFFER_COMPLETE) */

		/* Create and bind a FBO we will use for reading rendered data */
		gl.genFramebuffers(1, read_fbo_id_ptr);
		gl.bindFramebuffer(GL_READ_FRAMEBUFFER, *read_fbo_id_ptr);

		gl.framebufferTexture2D(GL_READ_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, *to_id_ptr, 0 /* level */);

		GLU_EXPECT_NO_ERROR(gl.getError(), "Could not configure read framebuffer object");

		if (gl.checkFramebufferStatus(GL_READ_FRAMEBUFFER) != GL_FRAMEBUFFER_COMPLETE)
		{
			TCU_FAIL("Read framebuffer is reported to be incomplete");
		} /* if (gl.checkFramebufferStatus(GL_READ_FRAMEBUFFER) != GL_FRAMEBUFFER_COMPLETE) */

		/* Fill the iteration-specific buffer objects with data */
		glw::GLuint  raw_arrays_bo_id = (is_instanced) ? m_instanced_raw_arrays_bo_id : m_noninstanced_raw_arrays_bo_id;
		unsigned int raw_arrays_bo_size = getRawArraysDataBufferSize(is_instanced);
		const void*  raw_arrays_data	= getRawArraysDataBuffer(is_instanced);
		glw::GLuint  unordered_arrays_bo_id =
			(is_instanced) ? m_instanced_unordered_arrays_bo_id : m_noninstanced_unordered_arrays_bo_id;
		unsigned int unordered_arrays_bo_size = getUnorderedArraysDataBufferSize(is_instanced);
		const void*  unordered_arrays_data	= getUnorderedArraysDataBuffer(is_instanced);
		glw::GLuint  unordered_elements_bo_id =
			(is_instanced) ? m_instanced_unordered_elements_bo_id : m_noninstanced_unordered_elements_bo_id;
		unsigned int unordered_elements_bo_size = getUnorderedElementsDataBufferSize(is_instanced);
		const void*  unordered_elements_data	= getUnorderedElementsDataBuffer(is_instanced);

		gl.bindBuffer(GL_ARRAY_BUFFER, raw_arrays_bo_id);
		gl.bufferData(GL_ARRAY_BUFFER, raw_arrays_bo_size, raw_arrays_data, GL_STATIC_COPY);

		gl.bindBuffer(GL_ARRAY_BUFFER, unordered_arrays_bo_id);
		gl.bufferData(GL_ARRAY_BUFFER, unordered_arrays_bo_size, unordered_arrays_data, GL_STATIC_COPY);

		gl.bindBuffer(GL_ARRAY_BUFFER, unordered_elements_bo_id);
		gl.bufferData(GL_ARRAY_BUFFER, unordered_elements_bo_size, unordered_elements_data, GL_STATIC_COPY);
	}

	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not configure test buffer objects");

	/* Create and bind a VAO */
	gl.genVertexArrays(1, &m_vao_id);
	gl.bindVertexArray(m_vao_id);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not generate & bind a vertex array object");

	/* Create and configure program & shader objects that will be used for the test case */
	const char* fs_code_ptr = fs_code.c_str();
	const char* gs_code_ptr = gs_code.c_str();
	const char* vs_code_ptr = vs_code.c_str();

	m_fs_id = gl.createShader(GL_FRAGMENT_SHADER);
	m_gs_id = gl.createShader(m_glExtTokens.GEOMETRY_SHADER);
	m_po_id = gl.createProgram();
	m_vs_id = gl.createShader(GL_VERTEX_SHADER);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not create shader/program objects");

	if (!buildProgram(m_po_id, m_fs_id, 1, &fs_code_ptr, m_gs_id, 1, &gs_code_ptr, m_vs_id, 1, &vs_code_ptr))
	{
		TCU_FAIL("Could not build shader program");
	}

	/* Retrieve uniform locations */
	m_renderingTargetSize_uniform_location		 = gl.getUniformLocation(m_po_id, "renderingTargetSize");
	m_singleRenderingTargetSize_uniform_location = gl.getUniformLocation(m_po_id, "singleRenderingTargetSize");
}